

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O0

void free_FFSTypeHandle(FFSTypeHandle_conflict f)

{
  uint uVar1;
  void *in_RDI;
  int i;
  uint in_stack_fffffffffffffff0;
  int iVar2;
  
  iVar2 = 0;
  if (*(long *)((long)in_RDI + 0x20) != 0) {
    FFSfree_conversion((IOConversionPtr)(ulong)in_stack_fffffffffffffff0);
  }
  while( true ) {
    uVar1 = in_stack_fffffffffffffff0 & 0xffffff;
    if (*(long *)((long)in_RDI + 0x10) != 0) {
      uVar1 = CONCAT13(*(long *)(*(long *)((long)in_RDI + 0x10) + (long)iVar2 * 8) != 0,
                       (int3)in_stack_fffffffffffffff0);
    }
    in_stack_fffffffffffffff0 = uVar1;
    if ((char)(in_stack_fffffffffffffff0 >> 0x18) == '\0') break;
    free_FFSTypeHandle((FFSTypeHandle_conflict)CONCAT44(iVar2,in_stack_fffffffffffffff0));
    *(undefined8 *)(*(long *)((long)in_RDI + 0x10) + (long)iVar2 * 8) = 0;
    iVar2 = iVar2 + 1;
  }
  free(*(void **)((long)in_RDI + 0x10));
  free(*(void **)((long)in_RDI + 0x18));
  free(in_RDI);
  return;
}

Assistant:

extern
void
free_FFSTypeHandle(FFSTypeHandle f)
{
    int i = 0;
    if (f->conversion) FFSfree_conversion(f->conversion);
    while(f->subformats && f->subformats[i]) {
	free_FFSTypeHandle(f->subformats[i]);
	f->subformats[i] = NULL;
	i++;
    }
    free(f->subformats);
    free(f->field_subformats);
    free(f);
}